

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typed_statement.cc
# Opt level: O2

shared_ptr<const_tchecker::typed_lvalue_expression_t> __thiscall
tchecker::typed_clock_to_clock_assign_statement_t::rclock_ptr
          (typed_clock_to_clock_assign_statement_t *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<const_tchecker::typed_lvalue_expression_t> sVar1;
  shared_ptr<const_tchecker::expression_t> local_20;
  
  std::dynamic_pointer_cast<tchecker::typed_expression_t_const,tchecker::expression_t_const>
            (&local_20);
  std::
  dynamic_pointer_cast<tchecker::typed_lvalue_expression_t_const,tchecker::typed_expression_t_const>
            ((shared_ptr<const_tchecker::typed_expression_t> *)this);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_20.super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  sVar1.super___shared_ptr<const_tchecker::typed_lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<const_tchecker::typed_lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (shared_ptr<const_tchecker::typed_lvalue_expression_t>)
         sVar1.
         super___shared_ptr<const_tchecker::typed_lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<tchecker::typed_lvalue_expression_t const> typed_clock_to_clock_assign_statement_t::rclock_ptr() const
{
  return std::dynamic_pointer_cast<tchecker::typed_lvalue_expression_t const>(rvalue_ptr());
}